

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_file_handle_add_cmp_func
               (fdb_file_handle *fhandle,char *kvs_name,fdb_custom_cmp_variable cmp_func,
               void *cmp_func_user_param)

{
  void *pvVar1;
  undefined8 *puVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  cmp_func_node *node;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    pvVar1 = calloc(1,0x10);
    *(void **)(in_RDI + 0x10) = pvVar1;
    list_init(*(list **)(in_RDI + 0x10));
  }
  puVar2 = (undefined8 *)calloc(1,0x28);
  if (in_RSI == (char *)0x0) {
    *puVar2 = 0;
  }
  else {
    sVar3 = strlen(in_RSI);
    pvVar1 = calloc(1,sVar3 + 1);
    *puVar2 = pvVar1;
    strcpy((char *)*puVar2,in_RSI);
  }
  puVar2[1] = in_RDX;
  puVar2[2] = in_RCX;
  list_push_back(*(list **)(in_RDI + 0x10),(list_elem *)(puVar2 + 3));
  return;
}

Assistant:

void fdb_file_handle_add_cmp_func(fdb_file_handle* fhandle,
                                  char* kvs_name,
                                  fdb_custom_cmp_variable cmp_func,
                                  void* cmp_func_user_param)
{
    struct cmp_func_node *node;

    // create list if not exist
    if (!fhandle->cmp_func_list) {
        fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
        list_init(fhandle->cmp_func_list);
    }

    node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
    if (kvs_name) {
        node->kvs_name = (char*)calloc(1, strlen(kvs_name)+1);
        strcpy(node->kvs_name, kvs_name);
    } else {
        // default KVS
        node->kvs_name = NULL;
    }
    node->func = cmp_func;
    node->user_param = cmp_func_user_param;
    list_push_back(fhandle->cmp_func_list, &node->le);
}